

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *value;
  char tmp [50];
  char *local_38;
  char *t;
  int i;
  int digit;
  unsigned_long nanos_local;
  int64_t sec_local;
  char *key_local;
  archive_string *as_local;
  
  tmp[0x29] = '\0';
  local_38 = tmp + 0x29;
  t._4_4_ = 0;
  _i = nanos;
  for (t._0_4_ = 10; 0 < (int)t && t._4_4_ == 0; t._0_4_ = (int)t + -1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _i;
    t._4_4_ = SUB164(auVar1 % ZEXT816(10),0);
    _i = _i / 10;
  }
  if (0 < (int)t) {
    for (; 0 < (int)t; t._0_4_ = (int)t + -1) {
      local_38[-1] = "0123456789"[t._4_4_];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = _i;
      t._4_4_ = SUB164(auVar2 % ZEXT816(10),0);
      _i = _i / 10;
      local_38 = local_38 + -1;
    }
    local_38[-1] = '.';
    local_38 = local_38 + -1;
  }
  value = format_int(local_38,sec);
  add_pax_attr(as,key,value);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}